

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  undefined4 extraout_var;
  uint uVar6;
  
  uVar6 = field_number << 3;
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  output->cur_ = pbVar4;
  if (uVar6 < 0x80) {
    *pbVar4 = (byte)uVar6 | 2;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar6 | 0x82;
    if (uVar6 < 0x4000) {
      pbVar4[1] = (byte)(uVar6 >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar2 = uVar6 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar2;
      } while (bVar1);
      *pbVar5 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar4;
  uVar6 = (*value->_vptr_MessageLite[10])(value);
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  output->cur_ = pbVar4;
  if (uVar6 < 0x80) {
    *pbVar4 = (byte)uVar6;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar6 | 0x80;
    if (uVar6 < 0x4000) {
      pbVar4[1] = (byte)(uVar6 >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar2 = uVar6 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar2;
      } while (bVar1);
      *pbVar5 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar4;
  iVar3 = (*value->_vptr_MessageLite[0xc])(value,pbVar4,output);
  output->cur_ = (uint8 *)CONCAT44(extraout_var,iVar3);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  WriteSubMessageMaybeToArray(size, value, output);
}